

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcold.c
# Opt level: O0

int ffgcfm(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          double *array,char *nularray,int *anynul,int *status)

{
  void *__ptr;
  long in_R8;
  long in_stack_00000008;
  int *in_stack_00000018;
  char *carray;
  float dummy;
  LONGLONG jj;
  LONGLONG ii;
  double in_stack_00007248;
  long in_stack_00007250;
  LONGLONG in_stack_00007258;
  LONGLONG in_stack_00007260;
  LONGLONG in_stack_00007268;
  int in_stack_00007274;
  fitsfile *in_stack_00007278;
  int in_stack_000072c0;
  double *in_stack_000072c8;
  char *in_stack_000072d0;
  int *in_stack_000072d8;
  int *in_stack_000072e0;
  long local_48;
  long local_40;
  
  __ptr = calloc(in_R8 << 1,1);
  ffgcld(in_stack_00007278,in_stack_00007274,in_stack_00007268,in_stack_00007260,in_stack_00007258,
         in_stack_00007250,in_stack_000072c0,in_stack_00007248,in_stack_000072c8,in_stack_000072d0,
         in_stack_000072d8,in_stack_000072e0);
  local_40 = 0;
  for (local_48 = 0; local_48 < in_R8; local_48 = local_48 + 1) {
    if ((*(char *)((long)__ptr + local_40) == '\0') &&
       (*(char *)((long)__ptr + local_40 + 1) == '\0')) {
      *(undefined1 *)(in_stack_00000008 + local_48) = 0;
    }
    else {
      *(undefined1 *)(in_stack_00000008 + local_48) = 1;
    }
    local_40 = local_40 + 2;
  }
  free(__ptr);
  return *in_stack_00000018;
}

Assistant:

int ffgcfm(fitsfile *fptr,   /* I - FITS file pointer                       */
           int  colnum,      /* I - number of column to read (1 = 1st col)  */
           LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
           LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
           LONGLONG  nelem,      /* I - number of values to read                */
           double *array,    /* O - array of values that are read           */
           char *nularray,   /* O - array of flags: 1 if null pixel; else 0 */
           int  *anynul,     /* O - set to 1 if any values are null; else 0 */
           int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU. Automatic
  datatype conversion will be performed if the datatype of the column does not
  match the datatype of the array parameter. The output values will be scaled 
  by the FITS TSCALn and TZEROn values if these values have been defined.
  Nularray will be set = 1 if the corresponding array pixel is undefined, 
  otherwise nularray will = 0.

  TSCAL and ZERO should not be used with complex values. 
*/
{
    LONGLONG ii, jj;
    float dummy = 0;
    char *carray;

    /* a complex double value is interpreted as a pair of double values,   */
    /* thus need to multiply the first element and number of elements by 2 */

    /* allocate temporary array */
    carray = (char *) calloc( (size_t) (nelem * 2), 1); 

    ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
     1, 2, dummy, array, carray, anynul, status);

    for (ii = 0, jj = 0; jj < nelem; ii += 2, jj++)
    {
       if (carray[ii] || carray[ii + 1])
          nularray[jj] = 1;
       else
          nularray[jj] = 0;
    }

    free(carray);    
    return(*status);
}